

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O0

uint8_t * __thiscall
cdns_class_id::parse_map_item(cdns_class_id *this,uint8_t *in,uint8_t *in_max,int64_t val,int *err)

{
  int *err_local;
  int64_t val_local;
  uint8_t *in_max_local;
  uint8_t *in_local;
  cdns_class_id *this_local;
  
  if (val == 0) {
    in_max_local = cbor_parse_int(in,in_max,&this->rr_type,0,err);
  }
  else if (val == 1) {
    in_max_local = cbor_parse_int(in,in_max,&this->rr_class,0,err);
  }
  else {
    in_max_local = (uint8_t *)0x0;
    *err = -2;
  }
  return in_max_local;
}

Assistant:

uint8_t* cdns_class_id::parse_map_item(uint8_t* in, uint8_t const * in_max, int64_t val, int* err)
{
    switch (val) {
    case 0:
        in = cbor_parse_int(in, in_max, &rr_type, 0, err);
        break;
    case 1:
        in = cbor_parse_int(in, in_max, &rr_class, 0, err);
        break;
    default:
        in = NULL;
        *err = CBOR_ILLEGAL_VALUE;
        break;
    }
    return in;
}